

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool cmLocalGeneratorCheckObjectName(string *objName,size_type dir_len,size_type max_total_len)

{
  ulong uVar1;
  long lVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view input;
  cmCryptoHash md5;
  string md5name;
  cmCryptoHash local_b0;
  long *local_a0;
  size_t local_98;
  long local_90 [2];
  string local_80;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  pointer local_28;
  
  uVar1 = max_total_len - dir_len;
  if (dir_len <= max_total_len && uVar1 != 0) {
    lVar2 = objName->_M_string_length - uVar1;
    if (objName->_M_string_length < uVar1 || lVar2 == 0) {
      return true;
    }
    uVar1 = std::__cxx11::string::find((char)objName,0x2f);
    if ((uVar1 != 0xffffffffffffffff) ||
       (uVar1 = std::__cxx11::string::rfind((char)objName,0x2f), 0x21 < uVar1 + 1)) {
      cmCryptoHash::cmCryptoHash(&local_b0,AlgoMD5);
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)objName);
      input._M_str = (char *)local_a0;
      input._M_len = local_98;
      cmCryptoHash::HashString_abi_cxx11_(&local_80,&local_b0,input);
      local_30 = objName->_M_string_length - uVar1;
      if (uVar1 <= objName->_M_string_length) {
        local_28 = (objName->_M_dataplus)._M_p + uVar1;
        local_40._M_len = local_80._M_string_length;
        local_40._M_str = local_80._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = &local_40;
        cmCatViews_abi_cxx11_(&local_60,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        std::__cxx11::string::_M_assign((string *)objName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_b0);
        return lVar2 + 0x20U <= uVar1;
      }
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar1);
    }
  }
  return false;
}

Assistant:

bool cmLocalGeneratorCheckObjectName(std::string& objName,
                                     std::string::size_type dir_len,
                                     std::string::size_type max_total_len)
{
  // Enforce the maximum file name length if possible.
  std::string::size_type max_obj_len = max_total_len;
  if (dir_len < max_total_len) {
    max_obj_len = max_total_len - dir_len;
    if (objName.size() > max_obj_len) {
      // The current object file name is too long.  Try to shorten it.
      return cmLocalGeneratorShortenObjectName(objName, max_obj_len);
    }
    // The object file name is short enough.
    return true;
  }
  // The build directory in which the object will be stored is
  // already too deep.
  return false;
}